

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
          *table,size_t pos,Entry *row,uint skip)

{
  Entry *params;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 func;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar3;
  ArrayPtr<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> AVar4;
  undefined1 *local_d8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_d0;
  size_t local_c8;
  Entry **local_c0;
  Entry *local_b8;
  undefined1 local_b0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_table_h:478:5)>
  _kjDefer480;
  bool success;
  Entry *local_68;
  size_t local_60;
  Maybe<unsigned_long> local_58;
  undefined1 local_48 [8];
  NullableValue<unsigned_long> existing;
  HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *indexObj;
  uint skip_local;
  Entry *row_local;
  size_t pos_local;
  Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
  *table_local;
  Maybe<unsigned_long> *result;
  
  row_local = (Entry *)pos;
  pos_local = (size_t)table;
  table_local = (Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
                 *)this;
  if (skip == 0) {
    MVar3 = Impl<1UL,_true>::insert
                      ((Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
                        *)this,(size_t)table,(Entry *)pos,(uint)row);
    aVar1 = MVar3.ptr.field_1;
  }
  else {
    aVar1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            get<0ul,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>&>
                      (&table->indexes);
    existing.field_1 = aVar1;
    AVar4 = Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::asPtr
                      ((Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)
                       pos_local);
    params = row_local;
    HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
    keyForRow<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry&>
              ((HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *)
               existing.field_1,row);
    local_68 = AVar4.ptr;
    local_60 = AVar4.size_;
    AVar4.size_ = (size_t)local_68;
    AVar4.ptr = (Entry *)aVar1.value;
    HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
    insert<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::StringPtr&>
              ((HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *)
               &local_58,AVar4,local_60,&params->key);
    other = kj::_::readMaybe<unsigned_long>(&local_58);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_48,other);
    Maybe<unsigned_long>::~Maybe(&local_58);
    puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_48);
    if (puVar2 != (unsigned_long *)0x0) {
      t = kj::_::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_48);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,t);
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_48);
    aVar1 = func;
    if (puVar2 == (unsigned_long *)0x0) {
      _kjDefer480._47_1_ = 0;
      local_d8 = &_kjDefer480.field_0x2f;
      local_d0 = existing.field_1;
      local_c8 = pos_local;
      local_c0 = &row_local;
      local_b8 = row;
      defer<kj::Table<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>>::Impl<0ul,false>::insert(kj::Table<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>>&,unsigned_long,kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry&,unsigned_int)::_lambda()_1_>
                ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_table_h:478:5)>
                  *)local_b0,(kj *)&local_d8,(Type *)func);
      Impl<1UL,_true>::insert
                ((Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
                  *)this,pos_local,row_local,(uint)row);
      _kjDefer480._47_1_ =
           Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)this,(void *)0x0);
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/table.h:478:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_table_h:478:5)>
                   *)local_b0);
      aVar1 = extraout_RDX;
    }
  }
  MVar3.ptr.field_1.value = aVar1.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }